

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_identity.cc
# Opt level: O1

void absl::lts_20240722::base_internal::SetCurrentThreadIdentity
               (ThreadIdentity *identity,ThreadIdentityReclaimerFunction reclaimer)

{
  void *pvVar1;
  sigset_t curr_signals;
  sigset_t all_signals;
  ThreadIdentityReclaimerFunction local_120;
  __sigset_t local_118;
  sigset_t local_98;
  
  local_120 = reclaimer;
  if ((_ZN4absl12lts_2024072213base_internal12_GLOBAL__N_123pthread_key_initializedE_0 & 1) != 0) {
    pvVar1 = pthread_getspecific((anonymous_namespace)::thread_identity_pthread_key);
    if (pvVar1 != (void *)0x0) {
      __assert_fail("CurrentThreadIdentityIfPresent() == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/base/internal/thread_identity.cc"
                    ,0x4e,
                    "void absl::base_internal::SetCurrentThreadIdentity(ThreadIdentity *, ThreadIdentityReclaimerFunction)"
                   );
    }
  }
  if ((anonymous_namespace)::init_thread_identity_key_once != 0xdd) {
    SetCurrentThreadIdentity((base_internal *)&local_120);
  }
  sigfillset(&local_98);
  pthread_sigmask(2,&local_98,&local_118);
  pthread_setspecific((anonymous_namespace)::thread_identity_pthread_key,identity);
  pthread_sigmask(2,&local_118,(__sigset_t *)0x0);
  return;
}

Assistant:

void SetCurrentThreadIdentity(ThreadIdentity* identity,
                              ThreadIdentityReclaimerFunction reclaimer) {
  assert(CurrentThreadIdentityIfPresent() == nullptr);
  // Associate our destructor.
  // NOTE: This call to pthread_setspecific is currently the only immovable
  // barrier to CurrentThreadIdentity() always being async signal safe.
#if ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_POSIX_SETSPECIFIC
  // NOTE: Not async-safe.  But can be open-coded.
  absl::call_once(init_thread_identity_key_once, AllocateThreadIdentityKey,
                  reclaimer);

#if defined(__wasi__) || defined(__EMSCRIPTEN__) || defined(__MINGW32__) || \
    defined(__hexagon__)
  // Emscripten, WASI and MinGW pthread implementations does not support
  // signals. See
  // https://kripken.github.io/emscripten-site/docs/porting/pthreads.html for
  // more information.
  pthread_setspecific(thread_identity_pthread_key,
                      reinterpret_cast<void*>(identity));
#else
  // We must mask signals around the call to setspecific as with current glibc,
  // a concurrent getspecific (needed for GetCurrentThreadIdentityIfPresent())
  // may zero our value.
  //
  // While not officially async-signal safe, getspecific within a signal handler
  // is otherwise OK.
  sigset_t all_signals;
  sigset_t curr_signals;
  sigfillset(&all_signals);
  pthread_sigmask(SIG_SETMASK, &all_signals, &curr_signals);
  pthread_setspecific(thread_identity_pthread_key,
                      reinterpret_cast<void*>(identity));
  pthread_sigmask(SIG_SETMASK, &curr_signals, nullptr);
#endif  // !__EMSCRIPTEN__ && !__MINGW32__

#elif ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_TLS
  // NOTE: Not async-safe.  But can be open-coded.
  absl::call_once(init_thread_identity_key_once, AllocateThreadIdentityKey,
                  reclaimer);
  pthread_setspecific(thread_identity_pthread_key,
                      reinterpret_cast<void*>(identity));
  thread_identity_ptr = identity;
#elif ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_CPP11
  thread_local std::unique_ptr<ThreadIdentity, ThreadIdentityReclaimerFunction>
      holder(identity, reclaimer);
  thread_identity_ptr = identity;
#else
#error Unimplemented ABSL_THREAD_IDENTITY_MODE
#endif
}